

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O3

int archive_write_client_close(archive_write_filter *f)

{
  archive *a;
  long *__ptr;
  code *pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  a = f->archive;
  __ptr = (long *)f->data;
  if ((void *)__ptr[3] != (void *)__ptr[2]) {
    uVar7 = *__ptr - __ptr[1];
    lVar6 = (long)(int)a[1].current_oemcp;
    if (lVar6 < 1) {
      uVar4 = (ulong)(int)a[1].current_codepage;
      uVar2 = uVar4;
    }
    else {
      lVar3 = uVar7 + lVar6 + -1;
      uVar4 = lVar3 - lVar3 % lVar6;
      uVar2 = (long)(int)a[1].current_codepage;
    }
    if ((long)uVar4 < (long)uVar2) {
      uVar2 = uVar4;
    }
    if (uVar2 - uVar7 != 0 && (long)uVar7 <= (long)uVar2) {
      memset((void *)__ptr[3],0,uVar2 - uVar7);
      uVar7 = uVar2;
    }
    if (uVar7 != 0) {
      lVar6 = __ptr[2];
      iVar5 = -0x1e;
      do {
        uVar2 = (*(code *)a[1].error_string.s)(a,a[1].current_code,lVar6,uVar7);
        if ((long)uVar2 < 1) goto LAB_00262c81;
        if (uVar7 < uVar2) {
          archive_set_error(a,-1,"write overrun");
          goto LAB_00262c81;
        }
        lVar6 = lVar6 + uVar2;
        uVar7 = uVar7 - uVar2;
      } while (uVar7 != 0);
    }
  }
  iVar5 = 0;
LAB_00262c81:
  pcVar1 = (code *)a[1].error_string.length;
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(a,a[1].current_code);
  }
  free((void *)__ptr[2]);
  free(__ptr);
  f->state = 4;
  return iVar5;
}

Assistant:

static int
archive_write_client_close(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state = (struct archive_none *)f->data;
	ssize_t block_length;
	ssize_t target_block_length;
	ssize_t bytes_written;
	size_t to_write;
	char *p;
	int ret = ARCHIVE_OK;

	/* If there's pending data, pad and write the last block */
	if (state->next != state->buffer) {
		block_length = state->buffer_size - state->avail;

		/* Tricky calculation to determine size of last block */
		if (a->bytes_in_last_block <= 0)
			/* Default or Zero: pad to full block */
			target_block_length = a->bytes_per_block;
		else
			/* Round to next multiple of bytes_in_last_block. */
			target_block_length = a->bytes_in_last_block *
			    ( (block_length + a->bytes_in_last_block - 1) /
			        a->bytes_in_last_block);
		if (target_block_length > a->bytes_per_block)
			target_block_length = a->bytes_per_block;
		if (block_length < target_block_length) {
			memset(state->next, 0,
			    target_block_length - block_length);
			block_length = target_block_length;
		}
		p = state->buffer;
		to_write = block_length;
		while (to_write > 0) {
			bytes_written = (a->client_writer)(&a->archive,
			    a->client_data, p, to_write);
			if (bytes_written <= 0) {
				ret = ARCHIVE_FATAL;
				break;
			}
			if ((size_t)bytes_written > to_write) {
				archive_set_error(&(a->archive),
						  -1, "write overrun");
				ret = ARCHIVE_FATAL;
				break;
			}
			p += bytes_written;
			to_write -= bytes_written;
		}
	}
	if (a->client_closer)
		(*a->client_closer)(&a->archive, a->client_data);
	free(state->buffer);
	free(state);

	/* Clear the close handler myself not to be called again. */
	f->state = ARCHIVE_WRITE_FILTER_STATE_CLOSED;
	return (ret);
}